

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O2

int ffgsvb(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
          uchar nulval,uchar *array,int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  LONGLONG LVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int local_3b8;
  char ldummy;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  int hdutype;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  fitsfile *local_228;
  long local_220;
  LONGLONG dsize [10];
  long dir [9];
  long str [9];
  long incr [9];
  long stp [9];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvb is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    iVar1 = 0x140;
  }
  else {
    iVar1 = fits_is_compressed_image(fptr,status);
    uVar14 = (ulong)(uint)naxis;
    if (iVar1 == 0) {
      iVar1 = ffghdt(fptr,&hdutype,status);
      if (iVar1 < 1) {
        if (hdutype == 0) {
          local_3a8 = (long)(int)(colnum + (uint)(colnum == 0));
          local_3b8 = 2;
          local_3a0 = 1;
          local_3b0 = local_3a8;
        }
        else {
          local_3a8 = trc[uVar14];
          local_3a0 = inc[uVar14];
          local_3b8 = colnum;
          local_3b0 = blc[uVar14];
        }
        if (anynul != (int *)0x0) {
          *anynul = 0;
        }
        lVar3 = 1;
        for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
          str[lVar4] = 1;
          stp[lVar4] = 1;
          incr[lVar4] = 1;
          dsize[lVar4] = 1;
          dir[lVar4] = 1;
        }
        for (; local_228 = fptr, lVar3 - uVar14 != 1; lVar3 = lVar3 + 1) {
          lVar4 = trc[lVar3 + -1];
          lVar8 = blc[lVar3 + -1];
          if (lVar4 < lVar8) {
            if (hdutype != 0) {
              snprintf((char *)blcll,0x51,"ffgsvb: illegal range specified for axis %ld");
              ffpmsg((char *)blcll);
              *status = 0x141;
              return 0x141;
            }
            dsize[lVar3 + 9] = -1;
            LVar11 = -1;
          }
          else {
            LVar11 = dsize[lVar3 + 9];
          }
          str[lVar3 + -1] = lVar8;
          stp[lVar3 + -1] = lVar4;
          incr[lVar3 + -1] = inc[lVar3 + -1];
          dsize[lVar3] = naxes[lVar3 + -1] * dsize[lVar3 + -1];
          dsize[lVar3 + -1] = LVar11 * dsize[lVar3 + -1];
        }
        dsize[uVar14] = dir[uVar14] * dsize[uVar14];
        if ((naxis == 1) && (*naxes == 1)) {
          lVar3 = (local_3a8 - local_3b0) / local_3a0;
          local_3a8 = local_3b0;
          local_358 = local_3a0;
        }
        else {
          lVar3 = ((stp[0] - CONCAT71(str[0]._1_7_,(uchar)str[0])) * dir[0]) / *inc;
          local_358 = dir[0] * incr[0];
        }
        local_290 = dir[8] * str[8];
        local_260 = stp[8] * dir[8];
        local_298 = dir[7] * str[7];
        local_268 = stp[7] * dir[7];
        local_2a0 = dir[6] * str[6];
        local_258 = stp[6] * dir[6];
        local_288 = dir[5] * str[5];
        local_250 = stp[5] * dir[5];
        local_280 = dir[4] * str[4];
        local_248 = stp[4] * dir[4];
        local_278 = dir[3] * str[3];
        local_240 = stp[3] * dir[3];
        local_270 = dir[2] * str[2];
        lVar8 = stp[2] * dir[2];
        local_230 = dir[1] * str[1];
        local_220 = stp[1] * dir[1];
        local_2a8 = (str[1] + -1) * dir[1] * dsize[1] + (str[2] + -1) * dir[2] * dsize[2] +
                    (str[3] + -1) * dir[3] * dsize[3] +
                    (str[4] + -1) * dir[4] * dsize[4] + (str[5] + -1) * dir[5] * dsize[5] +
                    (str[6] + -1) * dir[6] * dsize[6] + (str[7] + -1) * dir[7] * dsize[7] +
                    (str[8] + -1) * dir[8] * dsize[8] + CONCAT71(str[0]._1_7_,(uchar)str[0]);
        local_348 = incr[8];
        local_338 = dsize[8] * incr[8];
        local_350 = incr[7];
        local_340 = dsize[7] * incr[7];
        local_330 = incr[6];
        local_328 = dsize[6] * incr[6];
        local_320 = incr[5];
        local_318 = dsize[5] * incr[5];
        local_310 = incr[4];
        local_308 = dsize[4] * incr[4];
        local_300 = incr[3];
        local_2f8 = dsize[3] * incr[3];
        local_2d8 = incr[2];
        local_2d0 = dsize[2] * incr[2];
        lVar15 = 0;
        lVar4 = local_3a8;
        for (; local_3b0 <= lVar4; local_3b0 = local_3b0 + local_3a0) {
          local_390 = local_2a8;
          local_3a8 = lVar4;
          local_2f0 = local_278;
          local_2c8 = lVar8;
          for (lVar5 = local_290; lVar5 <= local_260; lVar5 = lVar5 + local_348) {
            local_398 = local_390;
            local_2e0 = lVar5;
            for (lVar9 = local_298; lVar9 <= local_268; lVar9 = lVar9 + local_350) {
              local_388 = local_398;
              local_2e8 = lVar9;
              for (lVar10 = local_2a0; lVar10 <= local_258; lVar10 = lVar10 + local_330) {
                local_380 = local_388;
                local_2c0 = lVar10;
                for (lVar12 = local_288; lVar12 <= local_250; lVar12 = lVar12 + local_320) {
                  local_378 = local_380;
                  local_2b8 = lVar12;
                  for (lVar13 = local_280; lVar13 <= local_248; lVar13 = lVar13 + local_310) {
                    local_370 = local_378;
                    lVar6 = local_278;
                    local_2b0 = lVar13;
                    for (; local_278 <= local_240; local_278 = local_278 + local_300) {
                      local_368 = local_370;
                      for (local_238 = local_270; lVar6 = local_368, lVar7 = local_230,
                          local_238 <= lVar8; local_238 = local_238 + local_2d8) {
                        for (; lVar7 <= local_220; lVar7 = lVar7 + incr[1]) {
                          iVar1 = ffgclb(local_228,local_3b8,local_3b0,lVar6,lVar3 + 1,local_358,1,
                                         nulval,array + lVar15,&ldummy,(int *)blcll,status);
                          if (0 < iVar1) goto LAB_00182eed;
                          if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                            *anynul = 1;
                          }
                          lVar15 = lVar15 + lVar3 + 1;
                          lVar6 = lVar6 + dsize[1] * incr[1];
                        }
                        local_368 = local_368 + local_2d0;
                        lVar4 = local_3a8;
                        lVar5 = local_2e0;
                        lVar8 = local_2c8;
                        lVar9 = local_2e8;
                        lVar10 = local_2c0;
                        lVar12 = local_2b8;
                        lVar13 = local_2b0;
                      }
                      local_370 = local_370 + local_2f8;
                      lVar6 = local_2f0;
                    }
                    local_378 = local_378 + local_308;
                    local_278 = lVar6;
                  }
                  local_380 = local_380 + local_318;
                }
                local_388 = local_388 + local_328;
              }
              local_398 = local_398 + local_340;
            }
            local_390 = local_390 + local_338;
          }
        }
      }
LAB_00182eed:
      iVar1 = *status;
    }
    else {
      for (uVar2 = 0; uVar14 != uVar2; uVar2 = uVar2 + 1) {
        blcll[uVar2] = blc[uVar2];
        dsize[uVar2] = trc[uVar2];
      }
      str[0]._0_1_ = nulval;
      fits_read_compressed_img(fptr,0xb,blcll,dsize,inc,1,str,array,(char *)0x0,anynul,status);
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int ffgsvb(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
           unsigned char nulval, /* I - value to set undefined pixels       */
           unsigned char *array, /* O - array to be filled and returned     */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii, i0, i1, i2, i3, i4, i5, i6, i7, i8, row, rstr, rstp, rinc;
    long str[9], stp[9], incr[9], dir[9];
    long nelem, nultyp, ninc, numcol;
    LONGLONG felem, dsize[10], blcll[9], trcll[9];
    int hdutype, anyf;
    char ldummy, msg[FLEN_ERRMSG];
    int  nullcheck = 1;
    unsigned char nullvalue;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvb is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TBYTE, blcll, trcll, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 1;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
        dir[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        if (hdutype == IMAGE_HDU)
        {
           dir[ii] = -1;
        }
        else
        {
          snprintf(msg, FLEN_ERRMSG,"ffgsvb: illegal range specified for axis %ld", ii + 1);
          ffpmsg(msg);
          return(*status = BAD_PIX_NUM);
        }
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
      dsize[ii] = dsize[ii] * dir[ii];
    }
    dsize[naxis] = dsize[naxis] * dir[naxis];

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0]*dir[0] - str[0]*dir[0]) / inc[0] + 1;
      ninc = incr[0] * dir[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]*dir[8]; i8 <= stp[8]*dir[8]; i8 += incr[8])
     {
      for (i7 = str[7]*dir[7]; i7 <= stp[7]*dir[7]; i7 += incr[7])
      {
       for (i6 = str[6]*dir[6]; i6 <= stp[6]*dir[6]; i6 += incr[6])
       {
        for (i5 = str[5]*dir[5]; i5 <= stp[5]*dir[5]; i5 += incr[5])
        {
         for (i4 = str[4]*dir[4]; i4 <= stp[4]*dir[4]; i4 += incr[4])
         {
          for (i3 = str[3]*dir[3]; i3 <= stp[3]*dir[3]; i3 += incr[3])
          {
           for (i2 = str[2]*dir[2]; i2 <= stp[2]*dir[2]; i2 += incr[2])
           {
            for (i1 = str[1]*dir[1]; i1 <= stp[1]*dir[1]; i1 += incr[1])
            {

              felem=str[0] + (i1 - dir[1]) * dsize[1] + (i2 - dir[2]) * dsize[2] + 
                             (i3 - dir[3]) * dsize[3] + (i4 - dir[4]) * dsize[4] +
                             (i5 - dir[5]) * dsize[5] + (i6 - dir[6]) * dsize[6] +
                             (i7 - dir[7]) * dsize[7] + (i8 - dir[8]) * dsize[8];

              if ( ffgclb(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &ldummy, &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}